

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O3

CURLcode pop3_connect(connectdata *conn,_Bool *done)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  CURLcode CVar4;
  bool bVar5;
  size_t max;
  char *first;
  char *first_00;
  char *pcVar6;
  
  *done = false;
  (conn->bits).close = false;
  (conn->proto).ftpc.pp.response_time = (long)"BuildFileStreamEv";
  (conn->proto).ftpc.pp.statemach_act = pop3_statemach_act;
  (conn->proto).ftpc.pp.endofresp = pop3_endofresp;
  (conn->proto).ftpc.pp.conn = conn;
  *(undefined8 *)((long)&conn->proto + 0x90) = 0xffffffffffffffff;
  Curl_pp_init(&(conn->proto).ftpc.pp);
  pcVar6 = conn->options;
  if ((pcVar6 != (char *)0x0) && (cVar1 = *pcVar6, cVar1 != '\0')) {
    CVar4 = CURLE_OK;
    bVar5 = true;
    first_00 = pcVar6;
    do {
      while ((first = pcVar6 + 1, cVar1 != '\0' && (cVar1 != '='))) {
        pcVar6 = first;
        cVar1 = *first;
      }
      iVar2 = curl_strnequal(first_00,"AUTH",4);
      if (iVar2 == 0) {
        CVar4 = CURLE_URL_MALFORMAT;
      }
      else {
        if (bVar5) {
          *(undefined8 *)((long)&conn->proto + 0x90) = 0;
        }
        for (max = 0; (first[max] != '\0' && (first[max] != ';')); max = max + 1) {
        }
        iVar2 = curl_strnequal(first,"*",max);
        if (iVar2 == 0) {
          iVar2 = curl_strnequal(first,"+APOP",max);
          if (iVar2 != 0) {
            (conn->proto).pop3c.preftype = 2;
            uVar3 = 0;
            goto LAB_004c9ca4;
          }
          iVar2 = curl_strnequal(first,"LOGIN",max);
          if (iVar2 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar3 = (conn->proto).pop3c.prefmech | 1;
            goto LAB_004c9ca4;
          }
          iVar2 = curl_strnequal(first,"PLAIN",max);
          if (iVar2 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar3 = (conn->proto).pop3c.prefmech | 2;
            goto LAB_004c9ca4;
          }
          iVar2 = curl_strnequal(first,"CRAM-MD5",max);
          if (iVar2 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar3 = (conn->proto).pop3c.prefmech | 4;
            goto LAB_004c9ca4;
          }
          iVar2 = curl_strnequal(first,"DIGEST-MD5",max);
          if (iVar2 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar3 = (conn->proto).pop3c.prefmech | 8;
            goto LAB_004c9ca4;
          }
          iVar2 = curl_strnequal(first,"GSSAPI",max);
          if (iVar2 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar3 = (conn->proto).pop3c.prefmech | 0x10;
            goto LAB_004c9ca4;
          }
          iVar2 = curl_strnequal(first,"NTLM",max);
          if (iVar2 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar3 = (conn->proto).pop3c.prefmech | 0x40;
            goto LAB_004c9ca4;
          }
          iVar2 = curl_strnequal(first,"XOAUTH2",max);
          if (iVar2 != 0) {
            (conn->proto).pop3c.preftype = 4;
            uVar3 = (conn->proto).pop3c.prefmech | 0x80;
            goto LAB_004c9ca4;
          }
        }
        else {
          (conn->proto).pop3c.preftype = 0xffffffff;
          uVar3 = 0xffffffff;
LAB_004c9ca4:
          (conn->proto).pop3c.prefmech = uVar3;
        }
        pcVar6 = first + (first[max] == ';') + max;
        bVar5 = false;
      }
      cVar1 = *pcVar6;
      first_00 = pcVar6;
    } while (cVar1 != '\0');
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
  (conn->proto).imapc.state = IMAP_SERVERGREET;
  CVar4 = pop3_multi_statemach(conn,done);
  return CVar4;
}

Assistant:

static CURLcode pop3_connect(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;
  struct pop3_conn *pop3c = &conn->proto.pop3c;
  struct pingpong *pp = &pop3c->pp;

  *done = FALSE; /* default to not done yet */

  /* We always support persistent connections in POP3 */
  connkeep(conn, "POP3 default");

  /* Set the default response time-out */
  pp->response_time = RESP_TIMEOUT;
  pp->statemach_act = pop3_statemach_act;
  pp->endofresp = pop3_endofresp;
  pp->conn = conn;

  /* Set the default preferred authentication type and mechanism */
  pop3c->preftype = POP3_TYPE_ANY;
  pop3c->prefmech = SASL_AUTH_ANY;

  /* Initialise the pingpong layer */
  Curl_pp_init(pp);

  /* Parse the URL options */
  result = pop3_parse_url_options(conn);
  if(result)
    return result;

  /* Start off waiting for the server greeting response */
  state(conn, POP3_SERVERGREET);

  result = pop3_multi_statemach(conn, done);

  return result;
}